

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O3

optional<helics::ActionMessage> * __thiscall
helics::ipc::OwnedQueue::getMessage
          (optional<helics::ActionMessage> *__return_storage_ptr__,OwnedQueue *this,int timeout)

{
  bool bVar1;
  pointer buffer;
  size_type buffer_size;
  block_t block;
  _Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  this_00;
  uint priority;
  timetype abs_time;
  size_t rx_size;
  ActionMessage cmd;
  ptime *abs_time_00;
  uint local_120;
  int local_11c;
  ptime local_118;
  size_type local_110;
  date_type local_104;
  time_rep_type local_100;
  time_duration_type local_f8;
  ptime local_f0;
  ActionMessage local_e8;
  
  if (this->connected == false) {
LAB_0025ff8a:
    (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload.
    super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
    super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
    return __return_storage_ptr__;
  }
  local_110 = 0;
  local_120 = 0;
  local_f8.
  super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  .ticks_.value_ =
       (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
        )((ulong)(uint)timeout * 1000);
  local_100.time_count_.value_ = (impl_type)0x7fffffffffffffff;
  local_11c = timeout;
LAB_0025fdef:
  if (timeout < 0) {
    this_00._M_head_impl =
         (this->rqueue)._M_t.
         super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
         .
         super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
         ._M_head_impl;
    buffer = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    buffer_size = (size_type)this->mxSize;
    local_118.
    super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
    .time_.time_count_.value_._0_4_ = 0xfffffffe;
    local_e8.messageAction = cmd_route_ack|cmd_init_not_ready|cmd_user_disconnect;
    local_e8.messageID = 0x7fffffff;
    abs_time_00 = &local_f0;
    boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
    counted_time_rep((counted_time_rep<boost::posix_time::millisec_posix_time_system_config> *)
                     abs_time_00,(date_type *)&local_118,(time_duration_type *)&local_e8);
    block = non_blocking;
    timeout = local_11c;
LAB_0025fef2:
    bVar1 = boost::interprocess::
            message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::
            do_receive(this_00._M_head_impl,block,buffer,buffer_size,&local_110,&local_120,
                       abs_time_00);
    if (!bVar1) goto LAB_0025ff8a;
  }
  else {
    local_118.
    super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
    .time_.time_count_.value_ =
         (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          )boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                     (boost::date_time::c_time::gmtime);
    local_118.
    super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
    .time_.time_count_.value_ =
         (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          )boost::date_time::
           counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
           ::add_time_duration((time_rep_type *)&local_118,local_f8);
    this_00._M_head_impl =
         (this->rqueue)._M_t.
         super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
         .
         super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
         ._M_head_impl;
    buffer = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    buffer_size = (size_type)this->mxSize;
    if (local_118.
        super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        .time_.time_count_.value_ !=
        (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
         )local_100.time_count_.value_) {
      block = timed;
      abs_time_00 = &local_118;
      goto LAB_0025fef2;
    }
    local_104.
    super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
    .days_ = (date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
              )0xfffffffe;
    local_e8.messageAction = cmd_route_ack|cmd_init_not_ready|cmd_user_disconnect;
    local_e8.messageID = 0x7fffffff;
    boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
    counted_time_rep((counted_time_rep<boost::posix_time::millisec_posix_time_system_config> *)
                     &local_f0,&local_104,(time_duration_type *)&local_e8);
    timeout = local_11c;
    boost::interprocess::
    message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>::do_receive
              (this_00._M_head_impl,blocking,buffer,buffer_size,&local_110,&local_120,&local_f0);
  }
  if (7 < local_110) {
    ActionMessage::ActionMessage
              (&local_e8,
               (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,local_110);
    if (local_e8.messageAction != cmd_invalid) {
      ActionMessage::ActionMessage((ActionMessage *)__return_storage_ptr__,&local_e8);
      (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload
      .super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_engaged = true;
      ActionMessage::~ActionMessage(&local_e8);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid command received ipc",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    ActionMessage::~ActionMessage(&local_e8);
  }
  goto LAB_0025fdef;
}

Assistant:

std::optional<ActionMessage> OwnedQueue::getMessage(int timeout)
    {
        if (!connected) {
            return std::nullopt;
        }
        size_t rx_size = 0;
        unsigned int priority{0};
        while (true) {
            if (timeout >= 0) {
                timetype abs_time = clocktype::universal_time();
                abs_time += boost::posix_time::milliseconds(timeout);
                bool res =
                    rqueue->timed_receive(buffer.data(), mxSize, rx_size, priority, abs_time);
                if (!res) {
                    return std::nullopt;
                }
            } else if (timeout <= 0) {
                bool res = rqueue->try_receive(buffer.data(), mxSize, rx_size, priority);
                if (!res) {
                    return std::nullopt;
                }
            }

            if (rx_size < 8) {
                continue;
            }
            ActionMessage cmd(reinterpret_cast<std::byte*>(buffer.data()), rx_size);
            if (!isValidCommand(cmd)) {
                std::cerr << "invalid command received ipc" << std::endl;
                continue;
            }
            return cmd;
        }
    }